

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointPseudoLog0::test_method(PointPseudoLog0 *this)

{
  int local_29c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_298;
  RealScalar local_270;
  undefined1 local_268;
  undefined8 local_260;
  shared_count sStack_258;
  Vector3d res;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_218;
  char *local_1f0;
  char *local_1e8;
  Matrix<double,_3,_1,_0,_3,_1> local_1e0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  RealSpace R3;
  Point y;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_238 = 0x3ff0000000000000;
  uStack_230 = 0x4000000000000000;
  local_228 = 0x4008000000000000;
  res.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._0_4_ =
       2;
  Eigen::operator*(&local_218,(int *)&res,(StorageBaseType *)&local_238);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_298,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_218,(type *)0x0);
  mnf::Manifold::createPoint((Ref *)&y);
  free(local_298.m_rhs);
  mnf::Point::pseudoLog0();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&res,(Matrix<double,__1,_1,_0,__1,_1> *)&local_298);
  free((void *)local_298._0_8_);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_1b8 = "";
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)&boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x7b);
  local_29c = 2;
  Eigen::operator*(&local_298,&local_29c,(StorageBaseType *)&local_238);
  local_270 = 1e-12;
  local_268 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_false>
              ::run(&res,&local_298,&local_270);
  local_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_218.m_rhs = &local_1e0;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       6.11736272579965e-318;
  local_1e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       6.11745659827236e-318;
  local_218.m_lhs._0_1_ = 0;
  local_218._0_8_ = &PTR__lazy_ostream_0013ec40;
  local_218.m_lhs.m_functor.m_other = (double)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  mnf::Point::~Point(&y);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog0)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);

  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;

  res = y.pseudoLog0();
  BOOST_CHECK(res.isApprox(2 * v));
}